

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::ArrayType::~ArrayType(ArrayType *this)

{
  ArrayType *this_local;
  
  (this->super_TypeEntry)._vptr_TypeEntry = (_func_int **)&PTR__ArrayType_004039f0;
  Field::~Field(&this->field);
  TypeEntry::~TypeEntry(&this->super_TypeEntry);
  return;
}

Assistant:

static bool classof(const TypeEntry* entry) {
    return entry->kind() == TypeEntryKind::Array;
  }